

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash2.cpp
# Opt level: O0

uint32_t MurmurHash2A(void *key,int len,uint32_t seed)

{
  uint uVar1;
  uint32_t t;
  uint32_t k;
  uint32_t h;
  uchar *data;
  uint32_t l;
  int r;
  uint32_t m;
  uint32_t seed_local;
  int len_local;
  void *key_local;
  
  h = seed;
  data = (uchar *)key;
  for (len_local = len; 3 < len_local; len_local = len_local + -4) {
    h = ((uint)(*(int *)data * 0x5bd1e995) >> 0x18 ^ *(int *)data * 0x5bd1e995) * 0x5bd1e995 ^
        h * 0x5bd1e995;
    data = data + 4;
  }
  t = 0;
  if (len_local != 1) {
    if (len_local != 2) {
      if (len_local != 3) goto LAB_001b8488;
      t = (uint)data[2] << 0x10;
    }
    t = (uint)data[1] << 8 ^ t;
  }
  t = *data ^ t;
LAB_001b8488:
  uVar1 = ((uint)(len * 0x5bd1e995) >> 0x18 ^ len * 0x5bd1e995) * 0x5bd1e995 ^
          ((t * 0x5bd1e995 >> 0x18 ^ t * 0x5bd1e995) * 0x5bd1e995 ^ h * 0x5bd1e995) * 0x5bd1e995;
  uVar1 = (uVar1 >> 0xd ^ uVar1) * 0x5bd1e995;
  return uVar1 >> 0xf ^ uVar1;
}

Assistant:

uint32_t MurmurHash2A ( const void * key, int len, uint32_t seed )
{
  const uint32_t m = 0x5bd1e995;
  const int r = 24;
  uint32_t l = len;

  const unsigned char * data = (const unsigned char *)key;

  uint32_t h = seed;

  while(len >= 4)
  {
    uint32_t k = *(uint32_t*)data;

    mmix(h,k);

    data += 4;
    len -= 4;
  }

  uint32_t t = 0;

  switch(len)
  {
  case 3: t ^= data[2] << 16;
  case 2: t ^= data[1] << 8;
  case 1: t ^= data[0];
  };

  mmix(h,t);
  mmix(h,l);

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;

  return h;
}